

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O0

void __thiscall
QThreadPool::startOnReservedThread(QThreadPool *this,function<void_()> *functionToRun)

{
  bool bVar1;
  QThreadPool *in_RSI;
  QRunnable *in_RDI;
  long in_FS_OFFSET;
  function<void_()> *in_stack_ffffffffffffff88;
  QThreadPool *in_stack_ffffffffffffffb8;
  function<void_()> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::function::operator_cast_to_bool((function<void_()> *)0x1f8ef1);
  if (bVar1) {
    std::function<void_()>::function(&local_28,in_stack_ffffffffffffff88);
    QRunnable::create((function<void_()> *)0x1f8f1f);
    startOnReservedThread(in_stack_ffffffffffffffb8,in_RDI);
    std::function<void_()>::~function((function<void_()> *)0x1f8f41);
  }
  else {
    releaseThread(in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThreadPool::startOnReservedThread(std::function<void()> functionToRun)
{
    if (!functionToRun)
        return releaseThread();

    startOnReservedThread(QRunnable::create(std::move(functionToRun)));
}